

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

ChNodeFEAxyzDD * __thiscall
chrono::fea::ChNodeFEAxyzDD::operator=(ChNodeFEAxyzDD *this,ChNodeFEAxyzDD *other)

{
  if (other != this) {
    ChNodeFEAxyzD::operator=(&this->super_ChNodeFEAxyzD,&other->super_ChNodeFEAxyzD);
    *(undefined8 *)&(this->super_ChNodeFEAxyzD).field_0x140 =
         *(undefined8 *)&(other->super_ChNodeFEAxyzD).field_0x140;
    *(undefined8 *)&this->field_0x148 = *(undefined8 *)&other->field_0x148;
    *(undefined8 *)&this->field_0x150 = *(undefined8 *)&other->field_0x150;
    (this->DD_dt).m_data[0] = (other->DD_dt).m_data[0];
    (this->DD_dt).m_data[1] = (other->DD_dt).m_data[1];
    (this->DD_dt).m_data[2] = (other->DD_dt).m_data[2];
    (this->DD_dtdt).m_data[0] = (other->DD_dtdt).m_data[0];
    (this->DD_dtdt).m_data[1] = (other->DD_dtdt).m_data[1];
    (this->DD_dtdt).m_data[2] = (other->DD_dtdt).m_data[2];
    ChVariablesGenericDiagonalMass::operator=
              (*(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzD).field_0x138,
               *(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyzD).field_0x138);
  }
  return this;
}

Assistant:

ChNodeFEAxyzDD& ChNodeFEAxyzDD::operator=(const ChNodeFEAxyzDD& other) {
    if (&other == this)
        return *this;

    ChNodeFEAxyzD::operator=(other);

    DD = other.DD;
    DD_dt = other.DD_dt;
    DD_dtdt = other.DD_dtdt;
    (*variables_DD) = (*other.variables_DD);
    return *this;
}